

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestring_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_12cdf1::CBSTest_ParseASN1Tag_Test::TestBody(CBSTest_ParseASN1Tag_Test *this)

{
  CBS_ASN1_TAG *lhs;
  int iVar1;
  anon_struct_32_3_59c873d7 *lhs_00;
  char *pcVar2;
  char *in_R9;
  long lVar3;
  bool bVar4;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<unsigned_char> __l_02;
  initializer_list<unsigned_char> __l_03;
  initializer_list<unsigned_char> __l_04;
  initializer_list<unsigned_char> __l_05;
  initializer_list<unsigned_char> __l_06;
  initializer_list<unsigned_char> __l_07;
  initializer_list<unsigned_char> __l_08;
  AssertHelper local_200;
  AssertionResult gtest_ar_;
  ScopedTrace gtest_trace_305;
  AssertionResult gtest_ar;
  allocator_type local_1ba;
  allocator_type local_1b9;
  allocator_type local_1b8;
  allocator_type local_1b7;
  allocator_type local_1b6;
  allocator_type local_1b5;
  allocator_type local_1b4;
  allocator_type local_1b3;
  allocator_type local_1b2;
  allocator_type local_1b1;
  CBS cbs;
  AssertHelper local_1a0;
  CBS_ASN1_TAG tag;
  uchar local_194 [4];
  CBS child;
  anon_struct_32_3_59c873d7 kTests [10];
  
  kTests[0].ok = true;
  kTests[0].tag = 0x20000010;
  _gtest_trace_305 = 0x30;
  __l._M_len = 2;
  __l._M_array = (iterator)&gtest_trace_305;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&kTests[0].in,__l,&local_1b1);
  kTests[1].ok = true;
  kTests[1].tag = 0xa0000004;
  local_194[2] = 0xa4;
  local_194[3] = '\0';
  __l_00._M_len = 2;
  __l_00._M_array = local_194 + 2;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&kTests[1].in,__l_00,&local_1b2);
  kTests[2].ok = true;
  kTests[2].tag = 0x4000001e;
  local_194[0] = '^';
  local_194[1] = '\0';
  __l_01._M_len = 2;
  __l_01._M_array = local_194;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&kTests[2].in,__l_01,&local_1b3);
  kTests[3].ok = true;
  kTests[3].tag = 0x4000001f;
  local_1a0.data_._0_2_ = 0x1f5f;
  local_1a0.data_._2_1_ = 0;
  __l_02._M_len = 3;
  __l_02._M_array = (iterator)&local_1a0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&kTests[3].in,__l_02,&local_1b4);
  kTests[4].ok = true;
  kTests[4].tag = 0x40000020;
  tag._0_2_ = 0x205f;
  tag._2_1_ = 0;
  __l_03._M_len = 3;
  __l_03._M_array = (iterator)&tag;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&kTests[4].in,__l_03,&local_1b5);
  kTests[5].ok = true;
  kTests[5].tag = 0xffffffff;
  gtest_ar._0_7_ = 0x7fffffff81ff;
  __l_04._M_len = 7;
  __l_04._M_array = &gtest_ar.success_;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&kTests[5].in,__l_04,&local_1b6);
  kTests[6].ok = false;
  kTests[6].tag = 0;
  cbs.data = (uint8_t *)CONCAT17(cbs.data._7_1_,0x7fffffff82ff);
  __l_05._M_len = 7;
  __l_05._M_array = (iterator)&cbs;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&kTests[6].in,__l_05,&local_1b7);
  kTests[7].ok = false;
  kTests[7].tag = 0;
  child.data._0_4_ = 0x808090ff;
  child.data._4_2_ = 0x80;
  child.data._6_1_ = 0;
  __l_06._M_len = 7;
  __l_06._M_array = (iterator)&child;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&kTests[7].in,__l_06,&local_1b8);
  kTests[8].ok = false;
  kTests[8].tag = 0;
  gtest_ar_._0_4_ = 0x1f805f;
  __l_07._M_len = 4;
  __l_07._M_array = &gtest_ar_.success_;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&kTests[8].in,__l_07,&local_1b9);
  kTests[9].ok = false;
  kTests[9].tag = 0;
  local_200.data_._0_4_ = 0x1e805f;
  __l_08._M_len = 4;
  __l_08._M_array = (iterator)&local_200;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&kTests[9].in,__l_08,&local_1ba);
  lVar3 = 0x140;
  lhs_00 = kTests;
  do {
    if (lVar3 == 0) {
LAB_001f0241:
      lVar3 = 0x128;
      do {
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                   (&kTests[0].ok + lVar3));
        lVar3 = lVar3 + -0x20;
      } while (lVar3 != -0x18);
      return;
    }
    gtest_ar._0_8_ =
         (lhs_00->in).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )((long)(lhs_00->in).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish - gtest_ar._0_8_);
    testing::ScopedTrace::ScopedTrace<Bytes>
              (&gtest_trace_305,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
               ,0x131,(Bytes *)&gtest_ar);
    cbs.data = (lhs_00->in).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
    cbs.len = (long)(lhs_00->in).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)cbs.data;
    iVar1 = CBS_get_any_asn1(&cbs,&child,&tag);
    gtest_ar_.success_ = iVar1 != 0;
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)&gtest_ar,"t.ok","!!CBS_get_any_asn1(&cbs, &child, &tag)",&lhs_00->ok,
               &gtest_ar_.success_);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_200,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x135,pcVar2);
      testing::internal::AssertHelper::operator=(&local_200,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper(&local_200);
      if (gtest_ar_._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      testing::ScopedTrace::~ScopedTrace(&gtest_trace_305);
      goto LAB_001f0241;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    if (lhs_00->ok == true) {
      lhs = &lhs_00->tag;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                ((internal *)&gtest_ar,"t.tag","tag",lhs,&tag);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        pcVar2 = "";
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar2 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_200,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x137,pcVar2);
        testing::internal::AssertHelper::operator=(&local_200,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper(&local_200);
        if (gtest_ar_._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      local_200.data_._0_4_ = 0;
      gtest_ar_._0_8_ = child.len;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                ((internal *)&gtest_ar,"0u","CBS_len(&child)",(uint *)&local_200,
                 (unsigned_long *)&gtest_ar_);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        pcVar2 = "";
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar2 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_200,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x138,pcVar2);
        testing::internal::AssertHelper::operator=(&local_200,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper(&local_200);
        if (gtest_ar_._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      local_200.data_._0_4_ = 0;
      gtest_ar_._0_8_ = cbs.len;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                ((internal *)&gtest_ar,"0u","CBS_len(&cbs)",(uint *)&local_200,
                 (unsigned_long *)&gtest_ar_);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        pcVar2 = "";
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar2 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_200,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x139,pcVar2);
        testing::internal::AssertHelper::operator=(&local_200,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper(&local_200);
        if (gtest_ar_._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      cbs.data = (lhs_00->in).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      cbs.len = (long)(lhs_00->in).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)cbs.data;
      iVar1 = CBS_peek_asn1_tag(&cbs,lhs_00->tag);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      bVar4 = iVar1 != 0;
      gtest_ar_.success_ = bVar4;
      if (!bVar4) {
        testing::Message::Message((Message *)&local_200);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar_,
                   (AssertionResult *)"CBS_peek_asn1_tag(&cbs, t.tag)","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x13c,(char *)gtest_ar._0_8_);
        testing::internal::AssertHelper::operator=(&local_1a0,(Message *)&local_200);
        testing::internal::AssertHelper::~AssertHelper(&local_1a0);
        std::__cxx11::string::~string((string *)&gtest_ar);
        if ((long *)CONCAT44(local_200.data_._4_4_,local_200.data_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_200.data_._4_4_,local_200.data_._0_4_) + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      iVar1 = CBS_peek_asn1_tag(&cbs,*lhs + 1);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar_.success_ = iVar1 == 0;
      if (!gtest_ar_.success_) {
        testing::Message::Message((Message *)&local_200);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar_,
                   (AssertionResult *)"CBS_peek_asn1_tag(&cbs, t.tag + 1)","true","false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x13d,(char *)gtest_ar._0_8_);
        testing::internal::AssertHelper::operator=(&local_1a0,(Message *)&local_200);
        testing::internal::AssertHelper::~AssertHelper(&local_1a0);
        std::__cxx11::string::~string((string *)&gtest_ar);
        if ((long *)CONCAT44(local_200.data_._4_4_,local_200.data_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_200.data_._4_4_,local_200.data_._0_4_) + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      iVar1 = CBS_get_asn1(&cbs,&child,*lhs);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar_.success_ = iVar1 != 0;
      if (iVar1 == 0) {
        testing::Message::Message((Message *)&local_200);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar_,
                   (AssertionResult *)"CBS_get_asn1(&cbs, &child, t.tag)","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x13f,(char *)gtest_ar._0_8_);
        testing::internal::AssertHelper::operator=(&local_1a0,(Message *)&local_200);
        testing::internal::AssertHelper::~AssertHelper(&local_1a0);
        std::__cxx11::string::~string((string *)&gtest_ar);
        if ((long *)CONCAT44(local_200.data_._4_4_,local_200.data_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_200.data_._4_4_,local_200.data_._0_4_) + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      local_200.data_._0_4_ = 0;
      gtest_ar_._0_8_ = child.len;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                ((internal *)&gtest_ar,"0u","CBS_len(&child)",(uint *)&local_200,
                 (unsigned_long *)&gtest_ar_);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        pcVar2 = "";
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar2 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_200,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x140,pcVar2);
        testing::internal::AssertHelper::operator=(&local_200,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper(&local_200);
        if (gtest_ar_._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      local_200.data_._0_4_ = 0;
      gtest_ar_._0_8_ = cbs.len;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                ((internal *)&gtest_ar,"0u","CBS_len(&cbs)",(uint *)&local_200,
                 (unsigned_long *)&gtest_ar_);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        pcVar2 = "";
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar2 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_200,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x141,pcVar2);
        testing::internal::AssertHelper::operator=(&local_200,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper(&local_200);
        if (gtest_ar_._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      cbs.data = (lhs_00->in).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      cbs.len = (long)(lhs_00->in).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)cbs.data;
      iVar1 = CBS_get_asn1(&cbs,&child,lhs_00->tag + 1);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar_.success_ = iVar1 == 0;
      if (iVar1 != 0) {
        testing::Message::Message((Message *)&local_200);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar_,
                   (AssertionResult *)"CBS_get_asn1(&cbs, &child, t.tag + 1)","true","false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x144,(char *)gtest_ar._0_8_);
        testing::internal::AssertHelper::operator=(&local_1a0,(Message *)&local_200);
        testing::internal::AssertHelper::~AssertHelper(&local_1a0);
        std::__cxx11::string::~string((string *)&gtest_ar);
        if ((long *)CONCAT44(local_200.data_._4_4_,local_200.data_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_200.data_._4_4_,local_200.data_._0_4_) + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
    }
    testing::ScopedTrace::~ScopedTrace(&gtest_trace_305);
    lVar3 = lVar3 + -0x20;
    lhs_00 = lhs_00 + 1;
  } while( true );
}

Assistant:

TEST(CBSTest, ParseASN1Tag) {
  const struct {
    bool ok;
    CBS_ASN1_TAG tag;
    std::vector<uint8_t> in;
  } kTests[] = {
      {true, CBS_ASN1_SEQUENCE, {0x30, 0}},
      {true, CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 4, {0xa4, 0}},
      {true, CBS_ASN1_APPLICATION | 30, {0x5e, 0}},
      {true, CBS_ASN1_APPLICATION | 31, {0x5f, 0x1f, 0}},
      {true, CBS_ASN1_APPLICATION | 32, {0x5f, 0x20, 0}},
      {true,
       CBS_ASN1_PRIVATE | CBS_ASN1_CONSTRUCTED | 0x1fffffff,
       {0xff, 0x81, 0xff, 0xff, 0xff, 0x7f, 0}},
      // Tag number fits in |uint32_t| but not |CBS_ASN1_TAG_NUMBER_MASK|.
      {false, 0, {0xff, 0x82, 0xff, 0xff, 0xff, 0x7f, 0}},
      // Tag number does not fit in |uint32_t|.
      {false, 0, {0xff, 0x90, 0x80, 0x80, 0x80, 0, 0}},
      // Tag number is not minimally-encoded
      {false, 0, {0x5f, 0x80, 0x1f, 0}},
      // Tag number should have used short form.
      {false, 0, {0x5f, 0x80, 0x1e, 0}},
  };
  for (const auto &t : kTests) {
    SCOPED_TRACE(Bytes(t.in));
    CBS_ASN1_TAG tag;
    CBS cbs, child;
    CBS_init(&cbs, t.in.data(), t.in.size());
    ASSERT_EQ(t.ok, !!CBS_get_any_asn1(&cbs, &child, &tag));
    if (t.ok) {
      EXPECT_EQ(t.tag, tag);
      EXPECT_EQ(0u, CBS_len(&child));
      EXPECT_EQ(0u, CBS_len(&cbs));

      CBS_init(&cbs, t.in.data(), t.in.size());
      EXPECT_TRUE(CBS_peek_asn1_tag(&cbs, t.tag));
      EXPECT_FALSE(CBS_peek_asn1_tag(&cbs, t.tag + 1));

      EXPECT_TRUE(CBS_get_asn1(&cbs, &child, t.tag));
      EXPECT_EQ(0u, CBS_len(&child));
      EXPECT_EQ(0u, CBS_len(&cbs));

      CBS_init(&cbs, t.in.data(), t.in.size());
      EXPECT_FALSE(CBS_get_asn1(&cbs, &child, t.tag + 1));
    }
  }
}